

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O1

void __thiscall
Js::DynamicType::DynamicType
          (DynamicType *this,DynamicType *type,DynamicTypeHandler *typeHandler,bool isLocked,
          bool isShared)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000009;
  
  Js::Type::Type(&this->super_Type,&type->super_Type);
  addr = &this->typeHandler;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->typeHandler).ptr = typeHandler;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->isLocked = isLocked;
  this->isShared = isShared;
  this->isCachedForChangePrototype = false;
  if (((int)CONCAT71(in_register_00000009,isLocked) != 0) && ((addr->ptr->flags & 4) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x12,"(!this->isLocked || this->typeHandler->GetIsLocked())",
                                "!this->isLocked || this->typeHandler->GetIsLocked()");
    if (!bVar2) goto LAB_00dc2708;
    *puVar3 = 0;
  }
  if ((this->isShared == true) && ((addr->ptr->flags & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x13,"(!this->isShared || this->typeHandler->GetIsShared())",
                                "!this->isShared || this->typeHandler->GetIsShared()");
    if (!bVar2) {
LAB_00dc2708:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

DynamicType::DynamicType(DynamicType * type, DynamicTypeHandler *typeHandler, bool isLocked, bool isShared)
        : Type(type), typeHandler(typeHandler), isLocked(isLocked), isShared(isShared)
#if DBG
        , isCachedForChangePrototype(false)
#endif
    {
        Assert(!this->isLocked || this->typeHandler->GetIsLocked());
        Assert(!this->isShared || this->typeHandler->GetIsShared());
    }